

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O3

UBool icu_63::DateFormatSymbols::arrayCompare
                (UnicodeString *array1,UnicodeString *array2,int32_t count)

{
  ushort uVar1;
  short sVar2;
  UnicodeString *pUVar3;
  UnicodeString *pUVar4;
  UBool UVar5;
  int len;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  if (array1 == array2) {
    return '\x01';
  }
  iVar6 = count + 1;
  pUVar3 = array2 + (uint)count;
  pUVar4 = array1 + (uint)count;
  do {
    iVar6 = iVar6 + -1;
    if (iVar6 < 1) {
      return '\x01';
    }
    uVar1 = pUVar4[-1].fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        len = pUVar4[-1].fUnion.fFields.fLength;
      }
      else {
        len = (int)(short)uVar1 >> 5;
      }
      sVar2 = pUVar3[-1].fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar7 = pUVar3[-1].fUnion.fFields.fLength;
      }
      else {
        iVar7 = (int)sVar2 >> 5;
      }
      if (((int)sVar2 & 1U) != 0) {
        return '\0';
      }
      if (len != iVar7) {
        return '\0';
      }
      UVar5 = icu_63::UnicodeString::doEquals(pUVar4 + -1,pUVar3 + -1,len);
      bVar8 = UVar5 != '\0';
    }
    else {
      bVar8 = (bool)(*(byte *)&pUVar3[-1].fUnion & 1);
    }
    pUVar3 = pUVar3 + -1;
    pUVar4 = pUVar4 + -1;
    if (bVar8 == false) {
      return '\0';
    }
  } while( true );
}

Assistant:

UBool
DateFormatSymbols::arrayCompare(const UnicodeString* array1,
                                const UnicodeString* array2,
                                int32_t count)
{
    if (array1 == array2) return TRUE;
    while (count>0)
    {
        --count;
        if (array1[count] != array2[count]) return FALSE;
    }
    return TRUE;
}